

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve_network.cpp
# Opt level: O0

CurveNetwork * __thiscall polyscope::CurveNetwork::setColor(CurveNetwork *this,vec3 newVal)

{
  undefined8 uVar1;
  CurveNetwork *in_RDI;
  undefined1 in_XMM0 [16];
  undefined4 in_XMM1_Da;
  undefined4 in_stack_fffffffffffffff0;
  
  uVar1 = vmovlpd_avx(in_XMM0);
  PersistentValue<glm::vec<3,float,(glm::qualifier)0>>::operator=
            ((PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_> *)
             CONCAT44((int)uVar1,in_stack_fffffffffffffff0),
             (vec<3,_float,_(glm::qualifier)0> *)CONCAT44(in_XMM1_Da,(int)((ulong)uVar1 >> 0x20)));
  requestRedraw();
  return in_RDI;
}

Assistant:

CurveNetwork* CurveNetwork::setColor(glm::vec3 newVal) {
  color = newVal;
  polyscope::requestRedraw();
  return this;
}